

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O3

GMM_PAGETABLEPool * __thiscall
GmmLib::GmmPageTableMgr::__AllocateNodePool
          (GmmPageTableMgr *this,uint32_t AddrAlignment,POOL_TYPE Type)

{
  GmmPageTablePool *pGVar1;
  HANDLE hAlloc;
  void *pGmmRes;
  GMM_STATUS GVar2;
  GmmPageTablePool *this_00;
  GMM_PAGETABLEPool **ppGVar3;
  GmmPageTablePool *Node;
  GmmPageTablePool *pGVar4;
  GMM_DEVICE_ALLOC local_68;
  GMM_GFX_ADDRESS local_38;
  
  local_68.CPUVA = 0;
  local_68.Priv = (GMM_RESOURCE_INFO *)0x0;
  local_68.Handle = (HANDLE)0x0;
  local_68.GfxVA = 0;
  if (this->AuxTTObj != (AuxTable *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&this->PoolLock);
  }
  local_68.Size = 0x200000;
  local_68.hCsr = this->hCsr;
  local_68.Alignment = AddrAlignment;
  GVar2 = __GmmDeviceAlloc(this->pClientContext,&this->DeviceCbInt,&local_68);
  pGmmRes = local_68.Priv;
  hAlloc = local_68.Handle;
  if (GVar2 == GMM_SUCCESS) {
    this_00 = (GmmPageTablePool *)operator_new(0x58);
    if (this_00 != (GmmPageTablePool *)0x0) {
      local_38 = local_68.CPUVA;
      GmmPageTablePool::GmmPageTablePool
                (this_00,hAlloc,(GMM_RESOURCE_INFO *)pGmmRes,local_68.GfxVA,Type);
      this_00->CPUAddress = local_38;
      ppGVar3 = &this->pPool;
      pGVar1 = this->pPool;
      if (pGVar1 == (GmmPageTablePool *)0x0) {
        this->NumNodePoolElements = 1;
      }
      else {
        this->NumNodePoolElements = this->NumNodePoolElements + 1;
        if (Type == POOL_TYPE_TRTTL2) {
          this_00->NextPool = pGVar1;
        }
        else {
          do {
            pGVar4 = pGVar1;
            pGVar1 = pGVar4->NextPool;
          } while (pGVar1 != (GmmPageTablePool *)0x0);
          ppGVar3 = &pGVar4->NextPool;
        }
      }
      *ppGVar3 = this_00;
    }
  }
  else {
    this_00 = (GmmPageTablePool *)0x0;
  }
  if (this->AuxTTObj != (AuxTable *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->PoolLock);
  }
  return this_00;
}

Assistant:

GmmLib::GMM_PAGETABLEPool *GmmLib::GmmPageTableMgr::__AllocateNodePool(uint32_t AddrAlignment, GmmLib::POOL_TYPE Type)
{
    GMM_STATUS         Status      = GMM_SUCCESS;
    GMM_RESOURCE_INFO *pGmmResInfo = NULL;
    GMM_PAGETABLEPool *pTTPool     = NULL;
    HANDLE             PoolHnd     = 0;
    GMM_CLIENT         ClientType;
    GMM_DEVICE_ALLOC   Alloc = {0};

    ENTER_CRITICAL_SECTION

    //Allocate pool, sized PAGETABLE_POOL_MAX_NODES pages, assignable to TR/Aux L1/L2 tables
    //SVM allocation, always resident
    Alloc.Size      = PAGETABLE_POOL_SIZE;
    Alloc.Alignment = AddrAlignment;
    Alloc.hCsr      = hCsr;

    Status = __GmmDeviceAlloc(pClientContext, &DeviceCbInt, &Alloc);

    if(Status != GMM_SUCCESS)
    {
        __GMM_ASSERT(0);
        EXIT_CRITICAL_SECTION
        return NULL;
    }

    PoolHnd     = Alloc.Handle;
    pGmmResInfo = (GMM_RESOURCE_INFO *)Alloc.Priv;

    pTTPool = new GMM_PAGETABLEPool(PoolHnd, pGmmResInfo, Alloc.GfxVA, Alloc.CPUVA, Type);


    if(pTTPool)
    {
        if(pPool)
        {
            NumNodePoolElements++;
            if(Type == POOL_TYPE_TRTTL2) // TRTT-L2 not 1st node in Pool LinkedList, place it at beginning
            {
                pPool = pPool->InsertInListAtBegin(pTTPool);
            }
            else
            {
                pTTPool = pPool->InsertInList(pTTPool);
            }
        }
        else
        {
            NumNodePoolElements = 1;
            pPool               = pTTPool;
        }
    }
    else
    {
        __GMM_ASSERT(0);
        Status = GMM_OUT_OF_MEMORY;
    }

    EXIT_CRITICAL_SECTION
    return (Status == GMM_SUCCESS) ? pTTPool : NULL;
}